

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O2

void duckdb::Bit::Finalize(bitstring_t *str)

{
  byte bVar1;
  char *pcVar2;
  idx_t i;
  idx_t n;
  
  if ((str->value).pointer.length < 0xd) {
    pcVar2 = (str->value).pointer.prefix;
  }
  else {
    pcVar2 = (str->value).pointer.ptr;
  }
  bVar1 = *pcVar2;
  for (n = 0; bVar1 != n; n = n + 1) {
    SetBitInternal(str,n,1);
  }
  string_t::Finalize(str);
  return;
}

Assistant:

void Bit::Finalize(bitstring_t &str) {
	// bit strings require all padding bits to be set to 1
	// this method sets all padding bits to 1
	auto padding = GetBitPadding(str);
	for (idx_t i = 0; i < idx_t(padding); i++) {
		Bit::SetBitInternal(str, i, 1);
	}
	str.Finalize();
	Bit::Verify(str);
}